

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.cpp
# Opt level: O0

int64_t npas4::GetRAMVirtualUsedByCurrentProcess(void)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  char local_a8 [8];
  char line [128];
  FILE *file;
  int64_t result;
  int BufferSize;
  
  file = (FILE *)0x0;
  __stream = fopen("/proc/self/status","r");
  do {
    pcVar2 = fgets(local_a8,0x80,__stream);
    if (pcVar2 == (char *)0x0) goto LAB_00101b33;
    iVar1 = strncmp(local_a8,"VmSize:",7);
  } while (iVar1 != 0);
  iVar1 = impl::ParseLine(local_a8);
  file = (FILE *)((long)iVar1 << 10);
LAB_00101b33:
  fclose(__stream);
  return (int64_t)file;
}

Assistant:

int64_t npas4::GetRAMVirtualUsedByCurrentProcess()
{
#ifdef WIN32
	PROCESS_MEMORY_COUNTERS_EX pmc;
	GetProcessMemoryInfo(GetCurrentProcess(), reinterpret_cast<PPROCESS_MEMORY_COUNTERS>(&pmc), sizeof(pmc));
	return pmc.PrivateUsage;
#else
	// Verified Correct.
	constexpr int BufferSize{128};
	int64_t result = 0;
	FILE* file = fopen("/proc/self/status", "r");
	char line[BufferSize];

	while(fgets(line, BufferSize, file) != NULL)
	{
		if(strncmp(line, "VmSize:", 7) == 0)
		{
			result = npas4::impl::ParseLine(line) * Kilobytes2Bytes;
			break;
		}
	}

	fclose(file);
	return result;
#endif
}